

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_transaction.cpp
# Opt level: O2

uint32_t __thiscall cfd::core::Transaction::GetTxInIndex(Transaction *this,Txid *txid,uint32_t vout)

{
  pointer pTVar1;
  bool bVar2;
  uint32_t uVar3;
  CfdException *this_00;
  long lVar4;
  ulong uVar5;
  allocator local_55;
  uint32_t local_54;
  undefined1 local_50 [32];
  
  lVar4 = 0;
  uVar5 = 0;
  local_54 = vout;
  do {
    pTVar1 = (this->vin_).super__Vector_base<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if ((ulong)(((long)(this->vin_).
                       super__Vector_base<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>._M_impl
                       .super__Vector_impl_data._M_finish - (long)pTVar1) / 0x90) <= uVar5) {
      local_50._0_8_ = "cfdcore_transaction.cpp";
      local_50._8_4_ = 0x201;
      local_50._16_8_ = "GetTxInIndex";
      logger::warn<>((CfdSourceLocation *)local_50,"Txid is not found.");
      this_00 = (CfdException *)__cxa_allocate_exception(0x30);
      ::std::__cxx11::string::string((string *)local_50,"Txid is not found.",&local_55);
      CfdException::CfdException(this_00,kCfdIllegalArgumentError,(string *)local_50);
      __cxa_throw(this_00,&CfdException::typeinfo,CfdException::~CfdException);
    }
    AbstractTxIn::GetTxid
              ((Txid *)local_50,
               (AbstractTxIn *)((long)&(pTVar1->super_AbstractTxIn)._vptr_AbstractTxIn + lVar4));
    bVar2 = Txid::Equals((Txid *)local_50,txid);
    if (bVar2) {
      uVar3 = AbstractTxIn::GetVout
                        ((AbstractTxIn *)
                         ((long)&(((this->vin_).
                                   super__Vector_base<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->super_AbstractTxIn).
                                 _vptr_AbstractTxIn + lVar4));
      Txid::~Txid((Txid *)local_50);
      if (uVar3 == local_54) {
        return (uint32_t)uVar5;
      }
    }
    else {
      Txid::~Txid((Txid *)local_50);
    }
    uVar5 = uVar5 + 1;
    lVar4 = lVar4 + 0x90;
  } while( true );
}

Assistant:

uint32_t Transaction::GetTxInIndex(const Txid &txid, uint32_t vout) const {
  for (size_t i = 0; i < vin_.size(); ++i) {
    if (vin_[i].GetTxid().Equals(txid) && vin_[i].GetVout() == vout) {
      return static_cast<uint32_t>(i);
    }
  }
  warn(CFD_LOG_SOURCE, "Txid is not found.");
  throw CfdException(kCfdIllegalArgumentError, "Txid is not found.");
}